

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O1

Factor * __thiscall libDAI::MaxPlus::beliefF(Factor *__return_storage_ptr__,MaxPlus *this,size_t I)

{
  pointer pvVar1;
  undefined1 auVar2 [16];
  Factor *this_00;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  VarSet *ns;
  long lVar6;
  size_t *psVar7;
  long lVar8;
  long *plVar9;
  undefined1 in_XMM2 [16];
  Prob prod_j;
  Prob prod;
  Factor *result;
  allocator_type local_71;
  vector<double,_std::allocator<double>_> local_70;
  TProb<double> local_58;
  Factor *local_40;
  double local_38;
  
  local_40 = __return_storage_ptr__;
  iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x50))
                    ((long *)CONCAT44(extraout_var,iVar3),I);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_58._p,(vector<double,_std::allocator<double>_> *)(lVar4 + 0x20));
  iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  plVar9 = *(long **)(*(long *)(CONCAT44(extraout_var_00,iVar3) + 0x88) + I * 0x18);
  while( true ) {
    iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    if (plVar9 == *(long **)(*(long *)(CONCAT44(extraout_var_01,iVar3) + 0x88) + 8 + I * 0x18))
    break;
    lVar4 = *(long *)(*(long *)&(this->_g->_fg)._E12ind.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[*plVar9].
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data + I * 8);
    pvVar1 = (this->_indices).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x30))
                      ((long *)CONCAT44(extraout_var_02,iVar3),*plVar9);
    auVar2 = vcvtusi2sd_avx512f(in_XMM2,*(size_type *)(lVar5 + 8));
    local_38 = 1.0 / auVar2._0_8_;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_70,*(size_type *)(lVar5 + 8),&local_38,&local_71);
    iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    psVar7 = *(size_t **)(*(long *)(CONCAT44(extraout_var_03,iVar3) + 0x70) + *plVar9 * 0x18);
    while( true ) {
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
      if (psVar7 == *(size_t **)
                     (*(long *)(CONCAT44(extraout_var_04,iVar3) + 0x70) + 8 + *plVar9 * 0x18))
      break;
      if (*psVar7 != I) {
        if ((long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar6 = (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3;
          lVar5 = *(long *)&(this->_newmessages).
                            super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(long *)(*(long *)&(this->_g->_fg)._E12ind.
                                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[*plVar9].
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data + *psVar7 * 8)]._p
                            .super__Vector_base<double,_std::allocator<double>_>._M_impl;
          lVar8 = 0;
          do {
            local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8] =
                 *(double *)(lVar5 + lVar8 * 8) *
                 local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
        }
      }
      psVar7 = psVar7 + 1;
    }
    if ((long)local_58._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_58._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_58._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_58._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      lVar4 = *(long *)&pvVar1[lVar4].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data;
      lVar6 = 0;
      do {
        local_58._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] =
             local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[*(long *)(lVar4 + lVar6 * 8)] *
             local_58._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    plVar9 = plVar9 + 1;
  }
  iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  this_00 = local_40;
  ns = (VarSet *)
       (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x50))
                 ((long *)CONCAT44(extraout_var_05,iVar3),I);
  TFactor<double>::TFactor(this_00,ns,&local_58);
  TProb<double>::normalize(&this_00->_p,NORMPROB);
  if (local_58._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return this_00;
}

Assistant:

Factor MaxPlus::beliefF (size_t I) const {
        Prob prod( grm().factor(I).p() );

        for( FactorGraph::nb_cit j = grm().nbF(I).begin(); j != grm().nbF(I).end(); j++ ) {
            // ind is the precalculated Index(j,I) i.e. to x_I == k corresponds x_j == ind[k]
            const _ind_t *ind = &(index(*j, I));

            // prod_j will be the product of messages coming into j
            Prob prod_j( grm().var(*j).states() ); 
            for( FactorGraph::nb_cit J = grm().nbV(*j).begin(); J != grm().nbV(*j).end(); J++ ) 
                if( *J != I )   // for all J in nb(j) \ I 
                    prod_j *= newMessage(*j,*J);

            // multiply prod with prod_j
            for( size_t r = 0; r < prod.size(); r++ )
                prod[r] *= prod_j[(*ind)[r]];
        }

        Factor result( grm().factor(I).vars(), prod );
        result.normalize();
        
        return( result );

    /*  UNOPTIMIZED VERSION
     
        Factor prod( grm().factor(I) );
        for( FactorGraph::nb_cit i = grm().nbF(I).begin(); i != grm().nbF(I).end(); i++ ) {
            for( FactorGraph::nb_cit J = grm().nbV(*i).begin(); J != grm().nbV(*i).end(); J++ )
                if( *J != I )
                    prod *= Factor( grm().var(*i), newMessage(*i,*J)) );
        }
        return prod.normalized();*/
    }